

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

void __thiscall wabt::OptionParser::PrintHelp(OptionParser *this)

{
  int iVar1;
  pointer pAVar2;
  size_type sVar3;
  size_type sVar4;
  Option *option;
  long lVar5;
  pointer pOVar6;
  ulong uVar7;
  char *__format;
  pointer pOVar8;
  size_t i;
  ulong uVar9;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string flag;
  size_type *local_58;
  string line;
  
  printf("usage: %s [options]",(this->program_name_)._M_dataplus._M_p);
  lVar10 = 0x20;
  uVar9 = 0;
  do {
    pAVar2 = (this->arguments_).
             super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(this->arguments_).
                  super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2;
    if ((ulong)(lVar5 / 0x50) <= uVar9) {
      puts("\n");
      puts((this->description_)._M_dataplus._M_p);
      puts("options:");
      flag.field_2._8_8_ =
           (this->options_).
           super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      uVar9 = 0;
      pOVar8 = (this->options_).
               super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pOVar6 = pOVar8; pOVar6 != (pointer)flag.field_2._8_8_; pOVar6 = pOVar6 + 1) {
        sVar3 = (pOVar6->long_name)._M_string_length;
        if (sVar3 != 0) {
          sVar4 = (pOVar6->metavar)._M_string_length;
          lVar10 = sVar4 + 1;
          if (sVar4 == 0) {
            lVar10 = 0;
          }
          uVar7 = lVar10 + sVar3;
          if (uVar9 < uVar7) {
            uVar9 = uVar7;
          }
        }
      }
      for (; pOVar8 != (pointer)flag.field_2._8_8_; pOVar8 = pOVar8 + 1) {
        if ((pOVar8->short_name != '\0') || ((pOVar8->long_name)._M_string_length != 0)) {
          local_58 = &line._M_string_length;
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length._0_1_ = 0;
          if (pOVar8->short_name == '\0') {
            std::__cxx11::string::append((string *)&local_58,"      ");
          }
          else {
            std::__cxx11::string::string
                      ((string *)&local_a0,"  -",(allocator *)(line.field_2._M_local_buf + 0xf));
            std::operator+(&local_c0,&local_a0,pOVar8->short_name);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80,&local_c0,", ");
            std::__cxx11::string::append((string *)&local_58,(string *)local_80);
            std::__cxx11::string::~string((string *)local_80);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_a0);
          }
          local_80 = (undefined1  [8])&flag._M_string_length;
          flag._M_dataplus._M_p = (pointer)0x0;
          flag._M_string_length._0_1_ = 0;
          if ((pOVar8->long_name)._M_string_length != 0) {
            std::__cxx11::string::assign((string *)local_80,"--");
            if ((pOVar8->metavar)._M_string_length == 0) {
              std::__cxx11::string::append((string *)local_80,(string *)&pOVar8->long_name);
            }
            else {
              std::operator+(&local_a0,&pOVar8->long_name,'=');
              std::operator+(&local_c0,&local_a0,&pOVar8->metavar);
              std::__cxx11::string::append((string *)local_80,(string *)&local_c0);
              std::__cxx11::string::~string((string *)&local_c0);
              std::__cxx11::string::~string((string *)&local_a0);
            }
          }
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct
                    ((string *)&local_a0,(uVar9 + 10) - (long)flag._M_dataplus._M_p,' ');
          std::operator+(&local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,&local_a0);
          std::__cxx11::string::append((string *)&local_58,(string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_a0);
          if ((pOVar8->help)._M_string_length != 0) {
            std::__cxx11::string::append((string *)&local_58,(string *)&pOVar8->help);
          }
          puts((char *)local_58);
          std::__cxx11::string::~string((string *)local_80);
          std::__cxx11::string::~string((string *)&local_58);
        }
      }
      return;
    }
    iVar1 = *(int *)((long)&(pAVar2->name)._M_dataplus._M_p + lVar10);
    __format = " %s";
    if (iVar1 == 0) {
LAB_00d9b48a:
      printf(__format,*(undefined8 *)((long)pAVar2 + lVar10 + -0x20),lVar5 % 0x50);
    }
    else if (iVar1 == 1) {
      __format = " %s+";
      goto LAB_00d9b48a;
    }
    uVar9 = uVar9 + 1;
    lVar10 = lVar10 + 0x50;
  } while( true );
}

Assistant:

void OptionParser::PrintHelp() {
  printf("usage: %s [options]", program_name_.c_str());

  for (size_t i = 0; i < arguments_.size(); ++i) {
    Argument& argument = arguments_[i];
    switch (argument.count) {
      case ArgumentCount::One:
        printf(" %s", argument.name.c_str());
        break;

      case ArgumentCount::OneOrMore:
        printf(" %s+", argument.name.c_str());
        break;
    }
  }

  printf("\n\n");
  printf("%s\n", description_.c_str());
  printf("options:\n");

  const size_t kExtraSpace = 8;
  size_t longest_name_length = 0;
  for (const Option& option : options_) {
    size_t length;
    if (!option.long_name.empty()) {
      length = option.long_name.size();
      if (!option.metavar.empty()) {
        // +1 for '='.
        length += option.metavar.size() + 1;
      }
    } else {
      continue;
    }

    if (length > longest_name_length) {
      longest_name_length = length;
    }
  }

  for (const Option& option : options_) {
    if (!option.short_name && option.long_name.empty()) {
      continue;
    }

    std::string line;
    if (option.short_name) {
      line += std::string("  -") + option.short_name + ", ";
    } else {
      line += "      ";
    }

    std::string flag;
    if (!option.long_name.empty()) {
      flag = "--";
      if (!option.metavar.empty()) {
        flag += option.long_name + '=' + option.metavar;
      } else {
        flag += option.long_name;
      }
    }

    // +2 for "--" of the long flag name.
    size_t remaining = longest_name_length + kExtraSpace + 2 - flag.size();
    line += flag + std::string(remaining, ' ');

    if (!option.help.empty()) {
      line += option.help;
    }
    printf("%s\n", line.c_str());
  }
}